

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MicroString::SetAlias
          (MicroString *this,string_view data,Arena *arena,size_t inline_capacity)

{
  LargeRepKind LVar1;
  LargeRep *pLVar2;
  
  if ((((ulong)this->rep_ & 1) != 0) && (LVar1 = large_rep_kind(this), LVar1 == kAlias)) {
    pLVar2 = large_rep(this);
    pLVar2->payload = data._M_str;
    pLVar2->size = (uint32_t)data._M_len;
    return;
  }
  if (data._M_len <= inline_capacity) {
    SetImpl(this,data,arena,inline_capacity);
    return;
  }
  if ((((ulong)this->rep_ & 1) == 0) || (LVar1 = large_rep_kind(this), LVar1 != kAlias)) {
    if (arena == (Arena *)0x0) {
      if (((ulong)this->rep_ & 3) != 0) {
        DestroySlow(this);
      }
      pLVar2 = (LargeRep *)operator_new(0x10);
      pLVar2->payload = (char *)0x0;
      pLVar2->size = 0;
      pLVar2->capacity = 0;
    }
    else {
      pLVar2 = (LargeRep *)Arena::Allocate(arena,0x10);
      pLVar2->payload = (char *)0x0;
      pLVar2->size = 0;
      pLVar2->capacity = 0;
    }
    pLVar2->capacity = 0;
    this->rep_ = (void *)((ulong)pLVar2 | 1);
  }
  else {
    pLVar2 = large_rep(this);
  }
  pLVar2->payload = data._M_str;
  pLVar2->size = (uint32_t)data._M_len;
  LVar1 = large_rep_kind(this);
  if (LVar1 == kAlias) {
    return;
  }
  SetAlias();
}

Assistant:

void MicroString::SetAlias(absl::string_view data, Arena* arena,
                           size_t inline_capacity) {
  // If we already have an alias, reuse the block.
  if (is_large_rep() && large_rep_kind() == kAlias) {
    auto* h = large_rep();
    h->SetExternalBuffer(data);
    return;
  }
  // If we can fit in the inline rep, avoid allocating memory.
  if (data.size() <= inline_capacity) {
    return Set(data, arena, inline_capacity);
  }

  LargeRep* h;
  if (!is_large_rep() || large_rep_kind() != kAlias) {
    if (arena == nullptr) {
      Destroy();
    }

    h = Arena::Create<LargeRep>(arena);
    h->capacity = kAlias;
    rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) |
                                   kIsLargeRepTag);
  } else {
    h = large_rep();
  }
  h->SetExternalBuffer(data);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kAlias);
}